

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall de::Random::shuffle<tcu::RGBA*>(Random *this,RGBA *first,RGBA *last)

{
  int iVar1;
  difference_type dVar2;
  int local_28;
  int j;
  int i;
  int numItems;
  RGBA *last_local;
  RGBA *first_local;
  Random *this_local;
  
  dVar2 = std::distance<tcu::RGBA*>(first,last);
  local_28 = (int)dVar2;
  while (local_28 = local_28 + -1, 0 < local_28) {
    iVar1 = getInt(this,0,local_28);
    std::swap<tcu::RGBA>(first + local_28,first + iVar1);
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}